

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O2

void __thiscall
boost::runtime::argument_factory<unsigned_long,_false,_false>::produce_argument
          (argument_factory<unsigned_long,_false,_false> *this,cstring *source,cstring *param_name,
          arguments_store *store)

{
  cstring local_40;
  unsigned_long local_30;
  cstring local_28;
  cstring local_18;
  
  local_40.m_begin = param_name->m_begin;
  local_40.m_end = param_name->m_end;
  if (source->m_end == source->m_begin) {
    local_30 = this->m_optional_value;
  }
  else {
    local_28.m_begin = source->m_begin;
    local_28.m_end = source->m_end;
    local_18.m_begin = local_40.m_begin;
    local_18.m_end = local_40.m_end;
    local_30 = value_interpreter<unsigned_long,_false>::interpret
                         ((value_interpreter<unsigned_long,_false> *)this,&local_18,&local_28);
  }
  arguments_store::set<unsigned_long>(store,&local_40,&local_30);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }